

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void UpdateWindowInFocusOrderList(ImGuiWindow *window,bool just_created,ImGuiWindowFlags new_flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow **ppIVar3;
  uint uVar4;
  int i;
  bool bVar5;
  ImVector<ImGuiWindow_*> *pIVar6;
  ImGuiWindow *local_30;
  
  pIVar1 = GImGui;
  uVar4 = new_flags & 0x1000000;
  bVar5 = SUB41(uVar4 >> 0x18,0);
  local_30 = window;
  if ((~just_created & uVar4 >> 0x18 == (uint)window->IsExplicitChild) == 0 && bVar5 == false) {
    pIVar6 = &GImGui->WindowsFocusOrder;
    bVar2 = ImVector<ImGuiWindow_*>::contains(pIVar6,&local_30);
    if (bVar2) {
      __assert_fail("!g.WindowsFocusOrder.contains(window)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0x15ea,
                    "void UpdateWindowInFocusOrderList(ImGuiWindow *, bool, ImGuiWindowFlags)");
    }
    ImVector<ImGuiWindow_*>::push_back(pIVar6,&local_30);
    local_30->FocusOrder = (short)pIVar6->Size + -1;
    window = local_30;
  }
  else if ((uVar4 != 0 && !just_created) && uVar4 >> 0x18 != (uint)window->IsExplicitChild) {
    pIVar6 = &GImGui->WindowsFocusOrder;
    ppIVar3 = ImVector<ImGuiWindow_*>::operator[](pIVar6,(int)window->FocusOrder);
    if (*ppIVar3 != window) {
      __assert_fail("g.WindowsFocusOrder[window->FocusOrder] == window",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0x15f0,
                    "void UpdateWindowInFocusOrderList(ImGuiWindow *, bool, ImGuiWindowFlags)");
    }
    i = (int)window->FocusOrder;
    while (i = i + 1, i < pIVar6->Size) {
      ppIVar3 = ImVector<ImGuiWindow_*>::operator[](pIVar6,i);
      (*ppIVar3)->FocusOrder = (*ppIVar3)->FocusOrder + -1;
    }
    ImVector<ImGuiWindow_*>::erase(pIVar6,(pIVar1->WindowsFocusOrder).Data + window->FocusOrder);
    window->FocusOrder = -1;
  }
  window->IsExplicitChild = bVar5;
  return;
}

Assistant:

static void UpdateWindowInFocusOrderList(ImGuiWindow* window, bool just_created, ImGuiWindowFlags new_flags)
{
    ImGuiContext& g = *GImGui;

    const bool new_is_explicit_child = (new_flags & ImGuiWindowFlags_ChildWindow) != 0;
    const bool child_flag_changed = new_is_explicit_child != window->IsExplicitChild;
    if ((just_created || child_flag_changed) && !new_is_explicit_child)
    {
        IM_ASSERT(!g.WindowsFocusOrder.contains(window));
        g.WindowsFocusOrder.push_back(window);
        window->FocusOrder = (short)(g.WindowsFocusOrder.Size - 1);
    }
    else if (!just_created && child_flag_changed && new_is_explicit_child)
    {
        IM_ASSERT(g.WindowsFocusOrder[window->FocusOrder] == window);
        for (int n = window->FocusOrder + 1; n < g.WindowsFocusOrder.Size; n++)
            g.WindowsFocusOrder[n]->FocusOrder--;
        g.WindowsFocusOrder.erase(g.WindowsFocusOrder.Data + window->FocusOrder);
        window->FocusOrder = -1;
    }
    window->IsExplicitChild = new_is_explicit_child;
}